

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O2

void Abc_ExactTestSingleOutputAIG(int fVerbose)

{
  Abc_Ntk_t *pNtk;
  Gia_Man_t *p0;
  Gia_Man_t *p1;
  Gia_Man_t *pGVar1;
  Gia_Man_t *pGVar2;
  Gia_Man_t *pGVar3;
  int pArrTimeProfile [4];
  word pTruth [4];
  Cec_ParCec_t ParsCec;
  
  pTruth[2] = 0;
  pTruth[3] = 0;
  pTruth[0] = 0xcafe;
  pTruth[1] = 0;
  pArrTimeProfile[0] = 6;
  pArrTimeProfile[1] = 2;
  pArrTimeProfile[2] = 8;
  pArrTimeProfile[3] = 5;
  Cec_ManCecSetDefaultParams(&ParsCec);
  pNtk = Abc_NtkFromTruthTable(pTruth,4);
  Abc_NtkToAig(pNtk);
  p0 = Abc_NtkAigToGia(pNtk,1);
  p1 = Gia_ManFindExact(pTruth,4,1,-1,(int *)0x0,0,0,fVerbose);
  pGVar1 = Gia_ManMiter(p0,p1,0,1,0,0,1);
  if (pGVar1 == (Gia_Man_t *)0x0) {
    __assert_fail("pMiter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0xa03,"void Abc_ExactTestSingleOutputAIG(int)");
  }
  Cec_ManVerify(pGVar1,&ParsCec);
  Gia_ManStop(pGVar1);
  pGVar1 = Gia_ManFindExact(pTruth,4,1,3,(int *)0x0,0,0,fVerbose);
  pGVar2 = Gia_ManMiter(p0,pGVar1,0,1,0,0,1);
  if (pGVar2 == (Gia_Man_t *)0x0) {
    __assert_fail("pMiter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0xa09,"void Abc_ExactTestSingleOutputAIG(int)");
  }
  Cec_ManVerify(pGVar2,&ParsCec);
  Gia_ManStop(pGVar2);
  pGVar2 = Gia_ManFindExact(pTruth,4,1,9,pArrTimeProfile,50000,0,fVerbose);
  pGVar3 = Gia_ManMiter(p0,pGVar2,0,1,0,0,1);
  if (pGVar3 == (Gia_Man_t *)0x0) {
    __assert_fail("pMiter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0xa0f,"void Abc_ExactTestSingleOutputAIG(int)");
  }
  Cec_ManVerify(pGVar3,&ParsCec);
  Gia_ManStop(pGVar3);
  pGVar3 = Gia_ManFindExact(pTruth,4,1,2,(int *)0x0,50000,0,fVerbose);
  if (pGVar3 == (Gia_Man_t *)0x0) {
    pGVar3 = Gia_ManFindExact(pTruth,4,1,8,pArrTimeProfile,50000,0,fVerbose);
    if (pGVar3 == (Gia_Man_t *)0x0) {
      Gia_ManStop(p0);
      Gia_ManStop(p1);
      Gia_ManStop(pGVar1);
      Gia_ManStop(pGVar2);
      return;
    }
    __assert_fail("!Gia_ManFindExact( pTruth, 4, 1, 8, pArrTimeProfile, 50000, 0, fVerbose )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0xa15,"void Abc_ExactTestSingleOutputAIG(int)");
  }
  __assert_fail("!Gia_ManFindExact( pTruth, 4, 1, 2, NULL, 50000, 0, fVerbose )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                ,0xa13,"void Abc_ExactTestSingleOutputAIG(int)");
}

Assistant:

void Abc_ExactTestSingleOutputAIG( int fVerbose )
{
    word pTruth[4] = {0xcafe, 0, 0, 0};
    Abc_Ntk_t * pNtk;
    Gia_Man_t * pGia, * pGia2, * pGia3, * pGia4, * pMiter;
    Cec_ParCec_t ParsCec, * pPars = &ParsCec;
    int pArrTimeProfile[4] = {6, 2, 8, 5};

    Cec_ManCecSetDefaultParams( pPars );

    pNtk = Abc_NtkFromTruthTable( pTruth, 4 );
    Abc_NtkToAig( pNtk );
    pGia = Abc_NtkAigToGia( pNtk, 1 );

    pGia2 = Gia_ManFindExact( pTruth, 4, 1, -1, NULL, 0, 0, fVerbose );
    pMiter = Gia_ManMiter( pGia, pGia2, 0, 1, 0, 0, 1 );
    assert( pMiter );
    Cec_ManVerify( pMiter, pPars );
    Gia_ManStop( pMiter );

    pGia3 = Gia_ManFindExact( pTruth, 4, 1, 3, NULL, 0, 0, fVerbose );
    pMiter = Gia_ManMiter( pGia, pGia3, 0, 1, 0, 0, 1 );
    assert( pMiter );
    Cec_ManVerify( pMiter, pPars );
    Gia_ManStop( pMiter );

    pGia4 = Gia_ManFindExact( pTruth, 4, 1, 9, pArrTimeProfile, 50000, 0, fVerbose );
    pMiter = Gia_ManMiter( pGia, pGia4, 0, 1, 0, 0, 1 );
    assert( pMiter );
    Cec_ManVerify( pMiter, pPars );
    Gia_ManStop( pMiter );

    assert( !Gia_ManFindExact( pTruth, 4, 1, 2, NULL, 50000, 0, fVerbose ) );

    assert( !Gia_ManFindExact( pTruth, 4, 1, 8, pArrTimeProfile, 50000, 0, fVerbose ) );

    Gia_ManStop( pGia );
    Gia_ManStop( pGia2 );
    Gia_ManStop( pGia3 );
    Gia_ManStop( pGia4 );
}